

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-gear.c
# Opt level: O1

void inven_drop(object *obj,wchar_t amt)

{
  ushort uVar1;
  loc grid;
  _Bool _Var2;
  char cVar3;
  uint16_t uVar4;
  object **ppoVar5;
  ulong uVar6;
  object *obj_00;
  uint uVar7;
  ulong uVar8;
  char *fmt;
  ulong uVar9;
  bool bVar10;
  _Bool none_left;
  object *dropped;
  object *first;
  char name [80];
  _Bool local_9a;
  char local_99;
  object *local_98;
  object *local_90;
  char local_88 [88];
  
  local_9a = false;
  if ((L'\0' < amt) && (_Var2 = pile_contains(player->gear,obj), _Var2)) {
    local_99 = gear_to_label(player,obj);
    uVar6 = (ulong)z_info->quiver_size;
    bVar10 = uVar6 != 0;
    if (bVar10) {
      ppoVar5 = player->upkeep->quiver;
      if (*ppoVar5 == obj) {
        bVar10 = true;
      }
      else {
        uVar9 = 1;
        do {
          uVar8 = uVar9;
          if (uVar6 == uVar8) break;
          uVar9 = uVar8 + 1;
        } while (ppoVar5[uVar8] != obj);
        bVar10 = uVar8 < uVar6;
      }
    }
    if ((int)(uint)obj->number < amt) {
      amt = (uint)obj->number;
    }
    uVar1 = (player->body).count;
    if (uVar1 == 0) {
      uVar6 = 0;
    }
    else {
      ppoVar5 = &((player->body).slots)->obj;
      uVar9 = 0;
      do {
        uVar6 = uVar9;
        if (*ppoVar5 == obj) break;
        uVar9 = uVar9 + 1;
        ppoVar5 = ppoVar5 + 4;
        uVar6 = (ulong)uVar1;
      } while (uVar1 != uVar9);
    }
    if ((int)uVar6 < (int)(uint)uVar1) {
      inven_takeoff(obj);
    }
    local_98 = gear_object_for_use(player,obj,amt,false,&local_9a);
    object_desc(local_88,0x50,local_98,0x43,player);
    uVar7 = (uint)local_99;
    msg("You drop %s (%c).",local_88,(ulong)uVar7);
    if (local_98->artifact == (artifact *)0x0) {
      if (((((int)uVar6 < (int)(uint)uVar1) || (_Var2 = tval_can_have_charges(obj), _Var2)) ||
          (_Var2 = tval_is_rod(obj), _Var2)) || (0 < obj->timeout)) {
        local_90 = (object *)0x0;
        if (local_9a == true) {
          uVar4 = 0;
          obj_00 = local_98;
        }
        else {
          uVar4 = (uint16_t)obj->number;
          obj_00 = obj;
        }
      }
      else {
        uVar4 = object_pack_total(player,obj,false,&local_90);
        obj_00 = obj;
        if (uVar4 == 0) {
          obj_00 = local_98;
        }
      }
      object_desc(local_88,0x50,obj_00,(uint)uVar4 << 0x10 | 0x443,player);
      if (local_90 == (object *)0x0) {
        fmt = "You have %s (%c).";
      }
      else {
        cVar3 = gear_to_label(player,local_90);
        uVar7 = (uint)cVar3;
        if (local_90->number < uVar4) {
          fmt = "You have %s (1st %c).";
        }
        else {
          fmt = "You have %s (%c).";
        }
      }
      msg(fmt,local_88,(ulong)uVar7);
    }
    else {
      object_desc(local_88,0x50,local_98,0x13,player);
      msg("You no longer have the %s (%c).",local_88,(ulong)uVar7);
    }
    grid.x = (player->grid).x;
    grid.y = (player->grid).y;
    drop_near((chunk *)cave,&local_98,L'\0',grid,false,true);
    if (bVar10) {
      sound(0x81);
    }
    event_signal(EVENT_INVENTORY);
    event_signal(EVENT_EQUIPMENT);
  }
  return;
}

Assistant:

void inven_drop(struct object *obj, int amt)
{
	struct object *dropped;
	bool none_left = false;
	bool equipped = false;
	bool quiver;

	char name[80];
	char label;

	/* Error check */
	if (amt <= 0)
		return;

	/* Check it is still held, in case there were two drop commands queued
	 * for this item.  This is in theory not ideal, but in practice should
	 * be safe. */
	if (!object_is_carried(player, obj))
		return;

	/* Get where the object is now */
	label = gear_to_label(player, obj);

	/* Is it in the quiver? */
	quiver = object_is_in_quiver(player, obj);

	/* Not too many */
	if (amt > obj->number) amt = obj->number;

	/* Take off equipment, don't combine */
	if (object_is_equipped(player->body, obj)) {
		equipped = true;
		inven_takeoff(obj);
	}

	/* Get the object */
	dropped = gear_object_for_use(player, obj, amt, false, &none_left);

	/* Describe the dropped object */
	object_desc(name, sizeof(name), dropped, ODESC_PREFIX | ODESC_FULL,
		player);

	/* Message */
	msg("You drop %s (%c).", name, label);

	/* Describe what's left */
	if (dropped->artifact) {
		object_desc(name, sizeof(name), dropped,
			ODESC_FULL | ODESC_SINGULAR, player);
		msg("You no longer have the %s (%c).", name, label);
	} else {
		struct object *first;
		struct object *desc_target;
		uint16_t total;

		/*
		 * Like gear_object_for_use(), don't show an aggregate total
		 * if it was equipped or the item has charges/recharging
		 * notice that is specific to the stack.
		 */
		if (equipped || tval_can_have_charges(obj) || tval_is_rod(obj)
				|| obj->timeout > 0) {
			first = NULL;
			if (none_left) {
				total = 0;
				desc_target = dropped;
			} else {
				total = obj->number;
				desc_target = obj;
			}
		} else {
			total = object_pack_total(player, obj, false, &first);
			desc_target = (total) ? obj : dropped;
		}

		object_desc(name, sizeof(name), desc_target,
			ODESC_PREFIX | ODESC_FULL | ODESC_ALTNUM |
			(total << 16), player);
		if (!first) {
			msg("You have %s (%c).", name, label);
		} else {
			label = gear_to_label(player, first);
			if (total > first->number) {
				msg("You have %s (1st %c).", name, label);
			} else {
				msg("You have %s (%c).", name, label);
			}
		}
	}

	/* Drop it near the player */
	drop_near(cave, &dropped, 0, player->grid, false, true);

	/* Sound for quiver objects */
	if (quiver)
		sound(MSG_QUIVER);

	event_signal(EVENT_INVENTORY);
	event_signal(EVENT_EQUIPMENT);
}